

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::anon_unknown_6::ReportReflectionUsageMessageError
               (Descriptor *expected,Descriptor *actual,FieldDescriptor *field,char *method)

{
  size_type in_R9;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  LogMessage local_c0;
  ulong local_b0;
  char *local_a8;
  ulong local_a0;
  char *local_98;
  string local_90;
  ulong local_70;
  char *local_68;
  char *local_60;
  code *local_58;
  ulong *local_50;
  code *local_48;
  ulong *local_40;
  code *local_38;
  ulong *local_30;
  code *local_28;
  
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xe1);
  local_98 = (expected->all_names_).payload_;
  local_a0 = (ulong)*(ushort *)(local_98 + 2);
  local_98 = local_98 + ~local_a0;
  local_a8 = (actual->all_names_).payload_;
  local_b0 = (ulong)*(ushort *)(local_a8 + 2);
  local_a8 = local_a8 + ~local_b0;
  if (field == (FieldDescriptor *)0x0) {
    local_68 = "n/a";
    local_70 = 3;
  }
  else {
    local_68 = (field->all_names_).payload_;
    local_70 = (ulong)*(ushort *)(local_68 + 2);
    local_68 = local_68 + ~local_70;
  }
  local_30 = &local_70;
  local_58 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<char_const*>;
  local_50 = &local_a0;
  local_48 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_40 = &local_b0;
  local_38 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_28 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  format.size_ = (size_t)&local_60;
  format.data_ = (void *)0xd5;
  args.len_ = in_R9;
  args.ptr_ = (pointer)0x4;
  local_60 = method;
  absl::lts_20250127::str_format_internal::FormatPack_abi_cxx11_
            (&local_90,
             (str_format_internal *)
             "Protocol Buffer reflection usage error:\n  Method       : google::protobuf::Reflection::%s\n  Expected type: %s\n  Actual type  : %s\n  Field        : %s\n  Problem      : Message is not the right object for reflection"
             ,format,args);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_c0,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c0);
}

Assistant:

void ReportReflectionUsageMessageError(const Descriptor* expected,
                                       const Descriptor* actual,
                                       const FieldDescriptor* field,
                                       const char* method) {
  ABSL_LOG(FATAL) << absl::StrFormat(
      "Protocol Buffer reflection usage error:\n"
      "  Method       : google::protobuf::Reflection::%s\n"
      "  Expected type: %s\n"
      "  Actual type  : %s\n"
      "  Field        : %s\n"
      "  Problem      : Message is not the right object for reflection",
      method, expected->full_name(), actual->full_name(),
      (field != nullptr ? field->full_name() : "n/a"));
}